

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cc
# Opt level: O3

int __thiscall
iqnet::Connector_base::connect(Connector_base *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Socket *this_00;
  bool bVar1;
  int iVar2;
  Client_timeout *this_01;
  socklen_t __len_00;
  sockaddr *__addr_00;
  Timeout ms;
  Connect_processor connector;
  Reactor<iqnet::Null_lock> reactor;
  Connect_processor local_c0;
  Reactor<iqnet::Null_lock> local_88;
  
  local_88.super_Reactor_base._vptr_Reactor_base = (_func_int **)&PTR__Reactor_00188338;
  Reactor_poll_impl::Reactor_poll_impl(&local_88.impl);
  local_88.handlers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88.handlers._M_t._M_impl.super__Rb_tree_header._M_header;
  __len_00 = 0;
  local_88.handlers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88.handlers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88.handlers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88.handlers_states.
  super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88.handlers_states;
  local_88.handlers_states.
  super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  ._M_impl._M_node._M_size = 0;
  local_88.num_stoppers = 0;
  local_88.handlers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88.handlers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88.handlers_states.
  super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_88.handlers_states.
       super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  Connect_processor::Connect_processor(&local_c0,&local_88.super_Reactor_base);
  this_00 = &local_c0.sock;
  iVar2 = Socket::connect(this_00,(int)this + 8,__addr_00,__len_00);
  if ((char)iVar2 == '\0') {
    Reactor<iqnet::Null_lock>::register_handler(&local_88,&local_c0.super_Event_handler,OUTPUT);
    ms = -1;
    if (0 < __fd) {
      ms = __fd * 1000;
    }
    bVar1 = Reactor<iqnet::Null_lock>::handle_events(&local_88,ms);
    if (!bVar1) {
      Socket::close(this_00,ms);
      this_01 = (Client_timeout *)__cxa_allocate_exception(0x18);
      iqxmlrpc::Client_timeout::Client_timeout(this_01);
      __cxa_throw(this_01,&iqxmlrpc::Client_timeout::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = (*this->_vptr_Connector_base[2])(this,this_00);
  }
  else {
    iVar2 = (*this->_vptr_Connector_base[2])(this,this_00);
  }
  local_c0.super_Event_handler._vptr_Event_handler = (_func_int **)&PTR__Connect_processor_00188278;
  local_c0.sock._vptr_Socket = (_func_int **)&PTR__Socket_0018a6d8;
  local_c0.sock.peer._vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_00187f48;
  boost::detail::shared_count::~shared_count(&local_c0.sock.peer.impl_.pn);
  Reactor<iqnet::Null_lock>::~Reactor(&local_88);
  return iVar2;
}

Assistant:

iqxmlrpc::Client_connection*
Connector_base::connect(int timeout)
{
  Reactor<Null_lock> reactor;
  Connect_processor connector(reactor);
  bool done = connector.sock.connect( peer_addr );

  if (done)
    return create_connection( connector.sock );

  reactor.register_handler( &connector, Reactor_base::OUTPUT );

  int ms = timeout > 0 ? timeout*1000 : -1;
  if (!reactor.handle_events(ms)) {
    connector.sock.close();
    throw iqxmlrpc::Client_timeout();
  }

  return create_connection( connector.sock );
}